

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ResetStream
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,
          TokenStream<SGParser::Generator::RegExprParseToken> *psourceStream,size_t rememberLength)

{
  StreamBlock *pSVar1;
  size_t sVar2;
  size_t rememberLength_local;
  TokenStream<SGParser::Generator::RegExprParseToken> *psourceStream_local;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_local;
  
  std::
  map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
  ::clear(&this->Markers);
  while (this->pFirstBlock->pNext != (StreamBlock *)0x0) {
    pSVar1 = std::
             exchange<SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*,SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock*&>
                       (&this->pFirstBlock,&this->pFirstBlock->pNext);
    if (pSVar1 != (StreamBlock *)0x0) {
      operator_delete(pSVar1,0x1018);
    }
  }
  this->pThisBlock = this->pFirstBlock;
  this->pThisBlock->Index = 0;
  this->ThisPos = 0;
  this->pSourceStream = psourceStream;
  this->RememberLength = rememberLength;
  sVar2 = 0;
  if (psourceStream != (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0) {
    sVar2 = 0xffffffffffffffff;
  }
  this->LengthLeft = sVar2;
  this->Pos = 0;
  this->SourceEOFFlag = false;
  return;
}

Assistant:

void BacktrackingTokenStream<Token>::ResetStream(TokenStream<Token>* psourceStream,
                                                 size_t rememberLength) noexcept {
    // Release all markers
    Markers.clear();
    // Release all but one buffer
    while (pFirstBlock->pNext)
        delete std::exchange(pFirstBlock, pFirstBlock->pNext);

    pThisBlock        = pFirstBlock;
    pThisBlock->Index = 0u;
    ThisPos           = 0u;
    // Reset variables
    pSourceStream     = psourceStream;
    RememberLength    = rememberLength;
    LengthLeft        = psourceStream ? MaxSize : 0u;
    Pos               = 0u;
    SourceEOFFlag     = false;
}